

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

int __thiscall QOpenGLShaderProgram::attributeLocation(QOpenGLShaderProgram *this,QString *name)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1_helper((QString *)&QStack_38);
  if (QStack_38.ptr == (char *)0x0) {
    QStack_38.ptr = (char *)&QByteArray::_empty;
  }
  iVar1 = attributeLocation(this,QStack_38.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QOpenGLShaderProgram::attributeLocation(const QString& name) const
{
    return attributeLocation(name.toLatin1().constData());
}